

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O2

err_t bign96ParamsVal(bign_params *params)

{
  u64 *dest;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  size_t sVar5;
  size_t count;
  void *state;
  void *dest_00;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    return 0x6d;
  }
  if (params->l != 0x60) {
    return 0x1f6;
  }
  sVar4 = bign96Start_keep(bign96ParamsVal_deep);
  ec = (ec_o *)blobCreate(sVar4);
  if (ec == (ec_o *)0x0) {
    return 0x6e;
  }
  eVar2 = bign96Start(ec,params);
  if (eVar2 == 0) {
    sVar4 = ec->f->n;
    state = (void *)((long)&(ec->hdr).keep + (ec->hdr).keep);
    sVar5 = beltHash_keep();
    dest = (u64 *)(sVar5 + (long)state);
    dest_00 = (void *)((long)state + sVar5 + 0x40);
    beltHashStart(state);
    beltHashStepH(params->p,0x18,state);
    beltHashStepH(params->a,0x18,state);
    count = beltHash_keep();
    memCopy(dest_00,state,count);
    memCopy(dest,params->seed,8);
    beltHashStepH(dest,8,state);
    u64From(dest,dest,8);
    zzAddW2(dest,1,1);
    u64To(dest,8,dest);
    beltHashStepH(dest,8,dest_00);
    beltHashStepG((octet *)dest,state);
    beltHashStepG((octet *)((long)state + sVar5 + 0x20),dest_00);
    u64From(dest,dest,0x40);
    zzMod(dest,dest,8,ec->f->mod,sVar4,dest_00);
    u64To(dest,0x40,dest);
    bVar1 = (*ec->f->from)(dest,(octet *)dest,ec->f,dest_00);
    eVar2 = 0x1f6;
    if ((((bVar1 != 0) && (bVar1 = wwEq(dest,ec->B,sVar4), bVar1 != 0)) &&
        (bVar1 = wwIsZero(ec->B,sVar4), bVar1 == 0)) &&
       (((bVar1 = ecpIsValid(ec,dest_00), bVar1 != 0 &&
         (bVar1 = ecpIsSafeGroup(ec,0x32,dest_00), bVar1 != 0)) &&
        (iVar3 = zzJacobi(ec->B,sVar4,ec->f->mod,sVar4,dest_00), iVar3 == 1)))) {
      wwCopy(dest,ec->f->mod,sVar4);
      zzAddW2(dest,sVar4,1);
      wwShLo(dest,sVar4,2);
      qrPower(dest,ec->B,dest,sVar4,ec->f,dest_00);
      bVar1 = wwEq(dest,ec->base + sVar4,sVar4);
      if (bVar1 != 0) {
        bVar1 = ecHasOrderA(ec->base,ec,ec->order,sVar4,dest_00);
        eVar2 = 0;
        if (bVar1 != 0) goto LAB_001351d6;
      }
      eVar2 = 0x1f6;
    }
  }
LAB_001351d6:
  blobClose(ec);
  return eVar2;
}

Assistant:

err_t bign96ParamsVal(const bign_params* params)
{
	err_t code;
	size_t n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	octet* hash_state;		/* [beltHash_keep] состояние хэширования */
	octet* hash_data;		/* [8] данные хэширования */
	word* B;				/* [W_OF_B(512)] переменная B */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96ParamsVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// раскладка состояния
	hash_state = objEnd(ec, octet);
	hash_data = hash_state + beltHash_keep();
	B = (word*)hash_data;
	stack = hash_data + O_OF_B(512);
	// belt-hash(p..)
	beltHashStart(hash_state);
	beltHashStepH(params->p, 24, hash_state);
	// belt-hash(..a..)
	beltHashStepH(params->a, 24, hash_state);
	memCopy(stack, hash_state, beltHash_keep());
	// belt-hash(..seed)
	memCopy(hash_data, params->seed, 8);
	beltHashStepH(hash_data, 8, hash_state);
	// belt-hash(..seed + 1)
	wwFrom(B, hash_data, 8);
	zzAddW2(B, W_OF_O(8), 1);
	wwTo(hash_data, 8, B);
	beltHashStepH(hash_data, 8, stack);
	// B <- belt-hash(p || a || seed) || belt-hash(p || a || seed + 1)
	beltHashStepG(hash_data, hash_state);
	beltHashStepG(hash_data + 32, stack);
	wwFrom(B, hash_data, 64);
	// B <- B \mod p
	zzMod(B, B, W_OF_O(64), ec->f->mod, n, stack);
	wwTo(B, 64, B);
	// проверить условия алгоритма 6.1.4
	if (qrFrom(B, (octet*)B, ec->f, stack) &&
		wwEq(B, ec->B, n) &&
		!wwIsZero(ec->B, n) &&
		ecpIsValid(ec, stack) &&
		ecpIsSafeGroup(ec, 50, stack) &&
		zzJacobi(ec->B, n, ec->f->mod, n, stack) == 1)
	{
		// B <- b^{(p + 1) / 4} = \sqrt{b} mod p
		wwCopy(B, ec->f->mod, n);
		zzAddW2(B, n, 1);
		wwShLo(B, n, 2);
		qrPower(B, ec->B, B, n, ec->f, stack);
		// оставшиеся условия
		if (!wwEq(B, ecY(ec->base, n), n) ||
			!ecHasOrderA(ec->base, ec, ec->order, n, stack))
			code = ERR_BAD_PARAMS;
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}